

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O0

void __thiscall
TIFFImageHandler::WriteImageXObjectFilter
          (TIFFImageHandler *this,DictionaryContext *inImageDictionary,int inTileIndex)

{
  t2p_compress_t tVar1;
  bool bVar2;
  DictionaryContext *pDVar3;
  uint local_54;
  uint local_44;
  DictionaryContext *decodeParmsDictionary;
  int inTileIndex_local;
  DictionaryContext *inImageDictionary_local;
  TIFFImageHandler *this_local;
  
  if (this->mT2p->pdf_compression != T2P_COMPRESS_NONE) {
    DictionaryContext::WriteKey(inImageDictionary,&scFilter_abi_cxx11_);
    tVar1 = this->mT2p->pdf_compression;
    if (tVar1 == T2P_COMPRESS_G4) {
      DictionaryContext::WriteNameValue(inImageDictionary,&scCCITTFaxDecode_abi_cxx11_);
      DictionaryContext::WriteKey(inImageDictionary,&scDecodeParms_abi_cxx11_);
      pDVar3 = ObjectsContext::StartDictionary(this->mObjectsContext);
      DictionaryContext::WriteKey(pDVar3,&scK_abi_cxx11_);
      DictionaryContext::WriteIntegerValue(pDVar3,-1);
      if (*(int *)(this->mT2p->tiff_tiles + (ulong)this->mT2p->pdf_page * 0x28) == 0) {
        DictionaryContext::WriteKey(pDVar3,&scColumns_abi_cxx11_);
        DictionaryContext::WriteIntegerValue(pDVar3,(ulong)this->mT2p->tiff_width);
        DictionaryContext::WriteKey(pDVar3,&scRows_abi_cxx11_);
        DictionaryContext::WriteIntegerValue(pDVar3,(ulong)this->mT2p->tiff_length);
      }
      else {
        DictionaryContext::WriteKey(pDVar3,&scColumns_abi_cxx11_);
        bVar2 = TileIsRightEdge(this,inTileIndex);
        if (bVar2) {
          local_44 = *(uint *)(this->mT2p->tiff_tiles + (ulong)this->mT2p->pdf_page * 0x28 + 0x14);
        }
        else {
          local_44 = *(uint *)(this->mT2p->tiff_tiles + (ulong)this->mT2p->pdf_page * 0x28 + 4);
        }
        DictionaryContext::WriteIntegerValue(pDVar3,(ulong)local_44);
        DictionaryContext::WriteKey(pDVar3,&scRows_abi_cxx11_);
        bVar2 = TileIsBottomEdge(this,inTileIndex);
        if (bVar2) {
          local_54 = *(uint *)(this->mT2p->tiff_tiles + (ulong)this->mT2p->pdf_page * 0x28 + 0x18);
        }
        else {
          local_54 = *(uint *)(this->mT2p->tiff_tiles + (ulong)this->mT2p->pdf_page * 0x28 + 8);
        }
        DictionaryContext::WriteIntegerValue(pDVar3,(ulong)local_54);
      }
      if (this->mT2p->pdf_switchdecode == 0) {
        DictionaryContext::WriteKey(pDVar3,&scBlackIs1_abi_cxx11_);
        DictionaryContext::WriteBooleanValue(pDVar3,true);
      }
      ObjectsContext::EndDictionary(this->mObjectsContext,pDVar3);
    }
    else if ((tVar1 == T2P_COMPRESS_ZIP) &&
            (DictionaryContext::WriteNameValue(inImageDictionary,&scFlateDecode_abi_cxx11_),
            (uint)this->mT2p->pdf_compressionquality % 100 != 0)) {
      DictionaryContext::WriteKey(inImageDictionary,&scDecodeParms_abi_cxx11_);
      pDVar3 = ObjectsContext::StartDictionary(this->mObjectsContext);
      DictionaryContext::WriteKey(pDVar3,&scPredictor_abi_cxx11_);
      DictionaryContext::WriteIntegerValue
                (pDVar3,(long)(int)((uint)this->mT2p->pdf_compressionquality % 100));
      DictionaryContext::WriteKey(pDVar3,&scColumns_abi_cxx11_);
      DictionaryContext::WriteIntegerValue(pDVar3,(ulong)this->mT2p->tiff_width);
      DictionaryContext::WriteKey(pDVar3,&scColors_abi_cxx11_);
      DictionaryContext::WriteIntegerValue(pDVar3,(ulong)this->mT2p->tiff_samplesperpixel);
      DictionaryContext::WriteKey(pDVar3,&scBitsPerComponent_abi_cxx11_);
      DictionaryContext::WriteIntegerValue(pDVar3,(ulong)this->mT2p->tiff_bitspersample);
      ObjectsContext::EndDictionary(this->mObjectsContext,pDVar3);
    }
  }
  return;
}

Assistant:

void TIFFImageHandler::WriteImageXObjectFilter(DictionaryContext* inImageDictionary,int inTileIndex)
{
	DictionaryContext* decodeParmsDictionary;

	if(mT2p->pdf_compression==T2P_COMPRESS_NONE)
		return;

	// Filter
	inImageDictionary->WriteKey(scFilter);


	switch(mT2p->pdf_compression)
	{
		case T2P_COMPRESS_G4:
			inImageDictionary->WriteNameValue(scCCITTFaxDecode);

			// DecodeParms
			inImageDictionary->WriteKey(scDecodeParms);
			decodeParmsDictionary = mObjectsContext->StartDictionary();

			// K
			decodeParmsDictionary->WriteKey(scK);
			decodeParmsDictionary->WriteIntegerValue(-1);

			if(0 == mT2p->tiff_tiles[mT2p->pdf_page].tiles_tilecount)
			{
				// Columns
				decodeParmsDictionary->WriteKey(scColumns);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_width);

				// Rows
				decodeParmsDictionary->WriteKey(scRows);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_length);
			}
			else
			{
				// Columns
				decodeParmsDictionary->WriteKey(scColumns);
				decodeParmsDictionary->WriteIntegerValue(
					TileIsRightEdge(inTileIndex) ? 
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_edgetilewidth :
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_tilewidth
					);
			
				// Rows
				decodeParmsDictionary->WriteKey(scRows);
				decodeParmsDictionary->WriteIntegerValue(
					TileIsBottomEdge(inTileIndex) ? 
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_edgetilelength :
						mT2p->tiff_tiles[mT2p->pdf_page].tiles_tilelength
					);
			}

			if(mT2p->pdf_switchdecode == 0)
			{
				// BlackIs1
				decodeParmsDictionary->WriteKey(scBlackIs1);
				decodeParmsDictionary->WriteBooleanValue(true);
			}
			mObjectsContext->EndDictionary(decodeParmsDictionary);
			break;
		case T2P_COMPRESS_ZIP:
			inImageDictionary->WriteNameValue(scFlateDecode);

			if(mT2p->pdf_compressionquality%100)
			{
				// DecodeParms
				inImageDictionary->WriteKey(scDecodeParms);
				decodeParmsDictionary = mObjectsContext->StartDictionary();

				// Predictor
				decodeParmsDictionary->WriteKey(scPredictor);
				decodeParmsDictionary->WriteIntegerValue(mT2p->pdf_compressionquality%100);

				// Columns
				decodeParmsDictionary->WriteKey(scColumns);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_width);

				// Colors
				decodeParmsDictionary->WriteKey(scColors);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_samplesperpixel);

				// BitsPerComponent
				decodeParmsDictionary->WriteKey(scBitsPerComponent);
				decodeParmsDictionary->WriteIntegerValue(mT2p->tiff_bitspersample);

				mObjectsContext->EndDictionary(decodeParmsDictionary);
			}
			break;
        default:
            // do nothing
            break;
	}
}